

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O3

void __thiscall
kratos::MergeWireAssignmentsVisitor::get_stmts_to_remove<kratos::Generator>
          (MergeWireAssignmentsVisitor *this,Generator *generator,
          set<std::shared_ptr<kratos::Stmt>,_std::less<std::shared_ptr<kratos::Stmt>_>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
          *stmts_to_remove,
          set<std::shared_ptr<kratos::AssignStmt>,_std::less<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
          *sliced_stmts)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  _Base_ptr p_Var3;
  int iVar4;
  int iVar5;
  uint uVar6;
  vector<std::shared_ptr<kratos::AssignStmt>,std::allocator<std::shared_ptr<kratos::AssignStmt>>>
  *this_00;
  _Base_ptr p_Var7;
  _Rb_tree_node_base *p_Var8;
  undefined8 extraout_RDX;
  undefined8 uVar9;
  _Rb_tree_header *p_Var10;
  shared_ptr<kratos::AssignStmt> *stmt;
  pair<std::_Rb_tree_iterator<std::shared_ptr<kratos::Stmt>_>,_bool> pVar11;
  undefined1 local_a8 [8];
  map<std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>,_std::less<std::pair<kratos::Var_*,_kratos::Var_*>_>,_std::allocator<std::pair<const_std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>_>_>_>
  slice_vars;
  undefined1 local_68 [8];
  shared_ptr<kratos::VarSlice> left_slice;
  shared_ptr<kratos::VarSlice> right_slice;
  
  slice_vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&slice_vars;
  slice_vars._M_t._M_impl._0_4_ = 0;
  slice_vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  slice_vars._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  slice_vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  p_Var7 = (sliced_stmts->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var10 = &(sliced_stmts->_M_t)._M_impl.super__Rb_tree_header;
  slice_vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       slice_vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if ((_Rb_tree_header *)p_Var7 != p_Var10) {
    do {
      Var::as<kratos::VarSlice>((Var *)local_68);
      Var::as<kratos::VarSlice>
                ((Var *)&left_slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount);
      p_Var1 = *(_func_int **)((long)local_68 + 0x270);
      if ((*(int *)(p_Var1 + 0x168) != 2) &&
         (pp_Var2 = left_slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi[0x27]._vptr__Sp_counted_base, *(int *)(pp_Var2 + 0x2d) != 2))
      {
        iVar4 = (**(code **)(*(long *)p_Var1 + 0x38))(p_Var1);
        iVar5 = (**(code **)(*pp_Var2 + 0x38))(pp_Var2);
        if (iVar4 == iVar5) {
          if ((*(long *)(p_Var1 + 0xa8) - (long)*(int **)(p_Var1 + 0xa0) ==
               (long)pp_Var2[0x15] - (long)pp_Var2[0x14]) &&
             (**(int **)(p_Var1 + 0xa0) == *(int *)pp_Var2[0x14])) {
            slice_vars._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)p_Var1;
            this_00 = (vector<std::shared_ptr<kratos::AssignStmt>,std::allocator<std::shared_ptr<kratos::AssignStmt>>>
                       *)std::
                         map<std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>,_std::less<std::pair<kratos::Var_*,_kratos::Var_*>_>,_std::allocator<std::pair<const_std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>_>_>_>
                         ::operator[]((map<std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>,_std::less<std::pair<kratos::Var_*,_kratos::Var_*>_>,_std::allocator<std::pair<const_std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>_>_>_>
                                       *)local_a8,
                                      (key_type *)
                                      &slice_vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
            std::
            vector<std::shared_ptr<kratos::AssignStmt>,std::allocator<std::shared_ptr<kratos::AssignStmt>>>
            ::emplace_back<std::shared_ptr<kratos::AssignStmt>const&>
                      (this_00,(shared_ptr<kratos::AssignStmt> *)(p_Var7 + 1));
          }
        }
      }
      if (right_slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   right_slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
      if (left_slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   left_slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var10);
    p_Var8 = slice_vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (slice_vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)&slice_vars)
    {
      do {
        p_Var7 = p_Var8[1]._M_right;
        p_Var3 = p_Var8[1]._M_left;
        uVar6 = (**(code **)(**(long **)(p_Var8 + 1) + 0x38))();
        if ((long)p_Var7 - (long)p_Var3 >> 4 == (ulong)uVar6) {
          p_Var3 = p_Var8[1]._M_right;
          uVar9 = extraout_RDX;
          for (p_Var7 = p_Var8[1]._M_left; p_Var7 != p_Var3; p_Var7 = (_Base_ptr)&p_Var7->_M_left) {
            (**(code **)(**(long **)(p_Var8 + 1) + 0x98))(*(long **)(p_Var8 + 1),p_Var7,uVar9);
            (**(code **)(*(long *)p_Var8[1]._M_parent + 0x78))(p_Var8[1]._M_parent,p_Var7);
            pVar11 = std::
                     _Rb_tree<std::shared_ptr<kratos::Stmt>,std::shared_ptr<kratos::Stmt>,std::_Identity<std::shared_ptr<kratos::Stmt>>,std::less<std::shared_ptr<kratos::Stmt>>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                     ::_M_emplace_unique<std::shared_ptr<kratos::AssignStmt>const&>
                               ((_Rb_tree<std::shared_ptr<kratos::Stmt>,std::shared_ptr<kratos::Stmt>,std::_Identity<std::shared_ptr<kratos::Stmt>>,std::less<std::shared_ptr<kratos::Stmt>>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                                 *)stmts_to_remove,(shared_ptr<kratos::AssignStmt> *)p_Var7);
            uVar9 = pVar11._8_8_;
          }
          create_new_assignment
                    (generator,
                     (vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                      *)&p_Var8[1]._M_left,*(Var **)(p_Var8 + 1),(Var *)p_Var8[1]._M_parent);
        }
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
      } while (p_Var8 != (_Rb_tree_node_base *)&slice_vars);
    }
  }
  std::
  _Rb_tree<std::pair<kratos::Var_*,_kratos::Var_*>,_std::pair<const_std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>_>,_std::_Select1st<std::pair<const_std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>_>_>,_std::less<std::pair<kratos::Var_*,_kratos::Var_*>_>,_std::allocator<std::pair<const_std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::pair<kratos::Var_*,_kratos::Var_*>,_std::pair<const_std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>_>,_std::_Select1st<std::pair<const_std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>_>_>,_std::less<std::pair<kratos::Var_*,_kratos::Var_*>_>,_std::allocator<std::pair<const_std::pair<kratos::Var_*,_kratos::Var_*>,_std::vector<std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>_>_>_>
               *)local_a8);
  return;
}

Assistant:

void get_stmts_to_remove(T* generator, std::set<std::shared_ptr<Stmt>>& stmts_to_remove,
                             const std::set<std::shared_ptr<AssignStmt>>& sliced_stmts) const {
        // group the assignments together
        using AssignPair = std::pair<Var*, Var*>;
        std::map<AssignPair, std::vector<std::shared_ptr<AssignStmt>>> slice_vars;
        for (auto const& assign_stmt : sliced_stmts) {
            auto left_slice = assign_stmt->left()->as<VarSlice>();
            auto right_slice = assign_stmt->right()->as<VarSlice>();
            Var* left_parent = left_slice->parent_var;
            Var* right_parent = right_slice->parent_var;
            // only deal with 1D for now
            if (left_parent->type() == VarType::Slice) continue;
            if (right_parent->type() == VarType::Slice) continue;
            if (left_parent->width() != right_parent->width()) continue;
            if (left_parent->size().size() != right_parent->size().size() ||
                left_parent->size().front() != right_parent->size().front())
                continue;

            slice_vars[{left_parent, right_parent}].emplace_back(assign_stmt);
        }

        // merge the assignments
        for (auto const& [vars, stmts] : slice_vars) {
            const auto& [left, right] = vars;

            // NOTE:
            // we assume that at this stage we've passed the connectivity check
            if (stmts.size() != left->width()) continue;

            // remove left's sources and right's sink
            // also add it to the statements to remove
            for (auto const& stmt : stmts) {
                left->remove_source(stmt);
                right->remove_sink(stmt);
                stmts_to_remove.emplace(stmt);
            }
            // make new assignment
            create_new_assignment(generator, stmts, left, right);
        }
    }